

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_dxt_quality_string(crn_dxt_quality q)

{
  char *pcStack_10;
  crn_dxt_quality q_local;
  
  switch(q) {
  case cCRNDXTQualitySuperFast:
    pcStack_10 = "SuperFast";
    break;
  case cCRNDXTQualityFast:
    pcStack_10 = "Fast";
    break;
  case cCRNDXTQualityNormal:
    pcStack_10 = "Normal";
    break;
  case cCRNDXTQualityBetter:
    pcStack_10 = "Better";
    break;
  case cCRNDXTQualityUber:
    pcStack_10 = "Uber";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_dxt_quality_string(crn_dxt_quality q)
{
    switch (q)
    {
    case cCRNDXTQualitySuperFast:
        return "SuperFast";
    case cCRNDXTQualityFast:
        return "Fast";
    case cCRNDXTQualityNormal:
        return "Normal";
    case cCRNDXTQualityBetter:
        return "Better";
    case cCRNDXTQualityUber:
        return "Uber";
    default:
        break;
    }
    CRNLIB_ASSERT(false);
    return "?";
}